

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O2

void dxil_spv::emit_temp_storage_resolve(Impl *impl,Value *real_value,Id temp_storage)

{
  Id IVar1;
  Type *pTVar2;
  PointerType *this;
  Operation *this_00;
  Operation *this_01;
  
  pTVar2 = LLVMBC::Value::getType(real_value);
  this = LLVMBC::cast<LLVMBC::PointerType>(pTVar2);
  pTVar2 = LLVMBC::Type::getPointerElementType(&this->super_Type);
  IVar1 = Converter::Impl::get_type_id(impl,pTVar2,0);
  this_00 = Converter::Impl::allocate(impl,OpLoad,IVar1);
  Operation::add_id(this_00,temp_storage);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpStore);
  IVar1 = Converter::Impl::get_id_for_value(impl,real_value,0);
  Operation::add_id(this_01,IVar1);
  Operation::add_id(this_01,this_00->id);
  Converter::Impl::add(impl,this_01,false);
  return;
}

Assistant:

static void emit_temp_storage_resolve(Converter::Impl &impl, const llvm::Value *real_value, spv::Id temp_storage)
{
	auto *pointer_type = llvm::cast<llvm::PointerType>(real_value->getType());
	auto *pointee_type = pointer_type->getPointerElementType();
	spv::Id type_id = impl.get_type_id(pointee_type);

	// Load the result from the temp
	auto *load_op = impl.allocate(spv::OpLoad, type_id);
	load_op->add_id(temp_storage);
	impl.add(load_op);

	// Store the result in the alloca'ed value
	auto *store_op = impl.allocate(spv::OpStore);
	store_op->add_id(impl.get_id_for_value(real_value));
	store_op->add_id(load_op->id);
	impl.add(store_op);
}